

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O3

void MirrorRow_AVX2(uint8_t *src,uint8_t *dst,int width)

{
  bool bVar1;
  undefined1 auVar2 [32];
  long lVar3;
  long lVar4;
  undefined1 auVar5 [32];
  
  auVar5._16_16_ = (undefined1  [16])libyuv::kShuffleMirror;
  auVar5._0_16_ = (undefined1  [16])libyuv::kShuffleMirror;
  lVar3 = (long)width;
  do {
    auVar2 = vpshufb_avx2(*(undefined1 (*) [32])(src + lVar3 + -0x20),auVar5);
    auVar2 = vpermq_avx2(auVar2,0x4e);
    *(undefined1 (*) [32])dst = auVar2;
    dst = (uint8_t *)((long)dst + 0x20);
    lVar4 = lVar3 + -0x20;
    bVar1 = 0x1f < lVar3;
    lVar3 = lVar4;
  } while (lVar4 != 0 && bVar1);
  return;
}

Assistant:

void MirrorRow_AVX2(const uint8_t* src, uint8_t* dst, int width) {
  intptr_t temp_width = (intptr_t)(width);
  asm volatile(

      "vbroadcastf128 %3,%%ymm5                  \n"

      LABELALIGN
      "1:                                        \n"
      "vmovdqu     -0x20(%0,%2,1),%%ymm0         \n"
      "vpshufb     %%ymm5,%%ymm0,%%ymm0          \n"
      "vpermq      $0x4e,%%ymm0,%%ymm0           \n"
      "vmovdqu     %%ymm0,(%1)                   \n"
      "lea         0x20(%1),%1                   \n"
      "sub         $0x20,%2                      \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src),           // %0
        "+r"(dst),           // %1
        "+r"(temp_width)     // %2
      : "m"(kShuffleMirror)  // %3
      : "memory", "cc", "xmm0", "xmm5");
}